

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

wchar_t * fmt::v5::internal::
          format_decimal<unsigned_long,wchar_t,fmt::v5::internal::add_thousands_sep<wchar_t>>
                    (wchar_t *buffer,unsigned_long value,int num_digits,
                    add_thousands_sep<wchar_t> thousands_sep)

{
  assertion_failure *this;
  int in_EDX;
  long lVar1;
  ulong in_RSI;
  long in_RDI;
  uint index;
  uint index_1;
  wchar_t *end;
  char *in_stack_ffffffffffffffa8;
  add_thousands_sep<wchar_t> *in_stack_ffffffffffffffd0;
  ulong local_18;
  wchar_t **local_10;
  wchar_t **local_8;
  
  if (in_EDX < 0) {
    this = (assertion_failure *)__cxa_allocate_exception(0x10);
    assertion_failure::assertion_failure(this,in_stack_ffffffffffffffa8);
    __cxa_throw(this,&assertion_failure::typeinfo,assertion_failure::~assertion_failure);
  }
  local_8 = (wchar_t **)(in_RDI + (long)in_EDX * 4);
  local_18 = in_RSI;
  local_10 = local_8;
  while (99 < local_18) {
    lVar1 = (local_18 % 100) * 2;
    local_18 = local_18 / 100;
    *(int *)((long)local_10 + -4) = (int)(char)basic_data<void>::DIGITS[(int)lVar1 + 1];
    add_thousands_sep<wchar_t>::operator()(in_stack_ffffffffffffffd0,local_8);
    *(int *)(local_10 + -1) = (int)(char)basic_data<void>::DIGITS[lVar1];
    add_thousands_sep<wchar_t>::operator()(in_stack_ffffffffffffffd0,local_8);
    local_10 = local_10 + -1;
  }
  if (local_18 < 10) {
    *(int *)((long)local_10 + -4) = (int)local_18 + 0x30;
  }
  else {
    *(int *)((long)local_10 + -4) = (int)(char)basic_data<void>::DIGITS[(int)(local_18 << 1) + 1];
    add_thousands_sep<wchar_t>::operator()(in_stack_ffffffffffffffd0,local_8);
    *(int *)(local_10 + -1) = (int)(char)basic_data<void>::DIGITS[local_18 << 1 & 0xffffffff];
  }
  return (wchar_t *)local_8;
}

Assistant:

inline Char *format_decimal(Char *buffer, UInt value, int num_digits,
                            ThousandsSep thousands_sep) {
  FMT_ASSERT(num_digits >= 0, "invalid digit count");
  buffer += num_digits;
  Char *end = buffer;
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    unsigned index = static_cast<unsigned>((value % 100) * 2);
    value /= 100;
    *--buffer = static_cast<Char>(data::DIGITS[index + 1]);
    thousands_sep(buffer);
    *--buffer = static_cast<Char>(data::DIGITS[index]);
    thousands_sep(buffer);
  }
  if (value < 10) {
    *--buffer = static_cast<Char>('0' + value);
    return end;
  }
  unsigned index = static_cast<unsigned>(value * 2);
  *--buffer = static_cast<Char>(data::DIGITS[index + 1]);
  thousands_sep(buffer);
  *--buffer = static_cast<Char>(data::DIGITS[index]);
  return end;
}